

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O1

void BenchElastic<4u>(string *PATH)

{
  key_type *__k;
  _Base_ptr *pp_Var1;
  __node_base *p_Var2;
  iterator *piVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char cVar8;
  pointer ppbVar9;
  pointer ppbVar10;
  int iVar11;
  value_type *__val;
  Data<4U> *pDVar12;
  WavingSketch<8U,_1U,_4U> *this;
  ofstream *poVar13;
  long *plVar14;
  ostream *poVar15;
  uint *puVar16;
  iterator iVar17;
  mapped_type *pmVar18;
  long *plVar19;
  basic_ostream<char,_std::char_traits<char>_> **out;
  ulong uVar20;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  pointer ppbVar21;
  double dVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  pair<std::_Rb_tree_iterator<std::pair<unsigned_int,_Data<4U>_>_>,_std::_Rb_tree_iterator<std::pair<unsigned_int,_Data<4U>_>_>_>
  pVar27;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar28;
  count_type cnt;
  multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
  topk_items;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  outs;
  pair<unsigned_int,_Data<4U>_> p;
  HashMap<4U> mp;
  queue<bool,_std::deque<bool,_std::allocator<bool>_>_> hits [1];
  string file;
  bool is_hit;
  int local_184;
  _Rb_tree<std::pair<unsigned_int,_Data<4U>_>,_std::pair<unsigned_int,_Data<4U>_>,_std::_Identity<std::pair<unsigned_int,_Data<4U>_>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
  local_180;
  int *local_150;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  local_148;
  key_type local_128;
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_120;
  _Deque_base<bool,_std::allocator<bool>_> local_e8;
  long *local_90 [2];
  long local_80 [2];
  _Alloc_node local_70;
  double local_68;
  int local_5c;
  Data<4U> *local_58;
  double local_50;
  double local_48;
  double local_40;
  long local_38;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  printf("\x1b[0m\x1b[1;4;33m# Testing function: BenchElastic\n\x1b[0m");
  local_184 = 0;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"caida","");
  pDVar12 = read_standard_data<4u>((PATH->_M_dataplus)._M_p,record_length,&local_184);
  local_68 = (double)local_184;
  this = (WavingSketch<8U,_1U,_4U> *)operator_new(0xa8);
  WavingSketch<8U,_1U,_4U>::WavingSketch(this,0x4000);
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = pDVar12;
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_148.
       super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start + 6;
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[2] = (basic_ostream<char,_std::char_traits<char>_> *)0x0
  ;
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[3] = (basic_ostream<char,_std::char_traits<char>_> *)0x0
  ;
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[4] = (basic_ostream<char,_std::char_traits<char>_> *)0x0
  ;
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[5] = (basic_ostream<char,_std::char_traits<char>_> *)0x0
  ;
  *local_148.
   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
   ._M_impl.super__Vector_impl_data._M_start = (basic_ostream<char,_std::char_traits<char>_> *)0x0;
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[1] = (basic_ostream<char,_std::char_traits<char>_> *)0x0
  ;
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[2] = (basic_ostream<char,_std::char_traits<char>_> *)0x0
  ;
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[3] = (basic_ostream<char,_std::char_traits<char>_> *)0x0
  ;
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_148.
       super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  poVar13 = (ofstream *)operator_new(0x200);
  pp_Var1 = &local_180._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_180._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_180);
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_90[0]);
  p_Var2 = &local_120._M_before_begin;
  plVar19 = plVar14 + 2;
  if ((__node_base *)*plVar14 == (__node_base *)plVar19) {
    local_120._M_before_begin._M_nxt = (_Hash_node_base *)*plVar19;
    local_120._M_element_count = plVar14[3];
    local_120._M_buckets = &p_Var2->_M_nxt;
  }
  else {
    local_120._M_before_begin._M_nxt = (_Hash_node_base *)*plVar19;
    local_120._M_buckets = (__buckets_ptr)*plVar14;
  }
  local_120._M_bucket_count = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_120);
  piVar3 = &local_e8._M_impl.super__Deque_impl_data._M_start;
  plVar19 = plVar14 + 2;
  if ((iterator *)*plVar14 == (iterator *)plVar19) {
    local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar19;
    local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)plVar14[3];
    local_e8._M_impl.super__Deque_impl_data._M_map = &piVar3->_M_cur;
  }
  else {
    local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar19;
    local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)*plVar14;
  }
  local_e8._M_impl.super__Deque_impl_data._M_map_size = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::ofstream::ofstream(poVar13,(string *)&local_e8,_S_out);
  *local_148.
   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
   ._M_impl.super__Vector_impl_data._M_start =
       (basic_ostream<char,_std::char_traits<char>_> *)poVar13;
  if ((iterator *)local_e8._M_impl.super__Deque_impl_data._M_map != piVar3) {
    operator_delete(local_e8._M_impl.super__Deque_impl_data._M_map,
                    (ulong)(local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 1));
  }
  if ((__node_base *)local_120._M_buckets != p_Var2) {
    operator_delete(local_120._M_buckets,
                    (ulong)((long)&(local_120._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if ((_Base_ptr *)local_180._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)local_180._M_impl._0_8_,
                    (ulong)((long)&(local_180._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  poVar13 = (ofstream *)operator_new(0x200);
  local_180._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_180);
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_90[0]);
  plVar19 = plVar14 + 2;
  if ((__node_base *)*plVar14 == (__node_base *)plVar19) {
    local_120._M_before_begin._M_nxt = (_Hash_node_base *)*plVar19;
    local_120._M_element_count = plVar14[3];
    local_120._M_buckets = &p_Var2->_M_nxt;
  }
  else {
    local_120._M_before_begin._M_nxt = (_Hash_node_base *)*plVar19;
    local_120._M_buckets = (__buckets_ptr)*plVar14;
  }
  local_120._M_bucket_count = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_120);
  plVar19 = plVar14 + 2;
  if ((iterator *)*plVar14 == (iterator *)plVar19) {
    local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar19;
    local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)plVar14[3];
    local_e8._M_impl.super__Deque_impl_data._M_map = &piVar3->_M_cur;
  }
  else {
    local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar19;
    local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)*plVar14;
  }
  local_e8._M_impl.super__Deque_impl_data._M_map_size = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::ofstream::ofstream(poVar13,(string *)&local_e8,_S_out);
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[1] =
       (basic_ostream<char,_std::char_traits<char>_> *)poVar13;
  if ((iterator *)local_e8._M_impl.super__Deque_impl_data._M_map != piVar3) {
    operator_delete(local_e8._M_impl.super__Deque_impl_data._M_map,
                    (ulong)(local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 1));
  }
  if ((__node_base *)local_120._M_buckets != p_Var2) {
    operator_delete(local_120._M_buckets,
                    (ulong)((long)&(local_120._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if ((_Base_ptr *)local_180._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)local_180._M_impl._0_8_,
                    (ulong)((long)&(local_180._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  poVar13 = (ofstream *)operator_new(0x200);
  local_180._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_180);
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_90[0]);
  plVar19 = plVar14 + 2;
  if ((__node_base *)*plVar14 == (__node_base *)plVar19) {
    local_120._M_before_begin._M_nxt = (_Hash_node_base *)*plVar19;
    local_120._M_element_count = plVar14[3];
    local_120._M_buckets = &p_Var2->_M_nxt;
  }
  else {
    local_120._M_before_begin._M_nxt = (_Hash_node_base *)*plVar19;
    local_120._M_buckets = (__buckets_ptr)*plVar14;
  }
  local_120._M_bucket_count = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_120);
  plVar19 = plVar14 + 2;
  if ((iterator *)*plVar14 == (iterator *)plVar19) {
    local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar19;
    local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)plVar14[3];
    local_e8._M_impl.super__Deque_impl_data._M_map = &piVar3->_M_cur;
  }
  else {
    local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar19;
    local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)*plVar14;
  }
  local_e8._M_impl.super__Deque_impl_data._M_map_size = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::ofstream::ofstream(poVar13,(string *)&local_e8,_S_out);
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[2] =
       (basic_ostream<char,_std::char_traits<char>_> *)poVar13;
  if ((iterator *)local_e8._M_impl.super__Deque_impl_data._M_map != piVar3) {
    operator_delete(local_e8._M_impl.super__Deque_impl_data._M_map,
                    (ulong)(local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 1));
  }
  if ((__node_base *)local_120._M_buckets != p_Var2) {
    operator_delete(local_120._M_buckets,
                    (ulong)((long)&(local_120._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if ((_Base_ptr *)local_180._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)local_180._M_impl._0_8_,
                    (ulong)((long)&(local_180._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  poVar13 = (ofstream *)operator_new(0x200);
  local_180._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_180);
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_90[0]);
  plVar19 = plVar14 + 2;
  if ((__node_base *)*plVar14 == (__node_base *)plVar19) {
    local_120._M_before_begin._M_nxt = (_Hash_node_base *)*plVar19;
    local_120._M_element_count = plVar14[3];
    local_120._M_buckets = &p_Var2->_M_nxt;
  }
  else {
    local_120._M_before_begin._M_nxt = (_Hash_node_base *)*plVar19;
    local_120._M_buckets = (__buckets_ptr)*plVar14;
  }
  local_120._M_bucket_count = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_120);
  plVar19 = plVar14 + 2;
  if ((iterator *)*plVar14 == (iterator *)plVar19) {
    local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar19;
    local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)plVar14[3];
    local_e8._M_impl.super__Deque_impl_data._M_map = &piVar3->_M_cur;
  }
  else {
    local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar19;
    local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)*plVar14;
  }
  local_e8._M_impl.super__Deque_impl_data._M_map_size = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::ofstream::ofstream(poVar13,(string *)&local_e8,_S_out);
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[3] =
       (basic_ostream<char,_std::char_traits<char>_> *)poVar13;
  if ((iterator *)local_e8._M_impl.super__Deque_impl_data._M_map != piVar3) {
    operator_delete(local_e8._M_impl.super__Deque_impl_data._M_map,
                    (ulong)(local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 1));
  }
  if ((__node_base *)local_120._M_buckets != p_Var2) {
    operator_delete(local_120._M_buckets,
                    (ulong)((long)&(local_120._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if ((_Base_ptr *)local_180._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)local_180._M_impl._0_8_,
                    (ulong)((long)&(local_180._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  poVar13 = (ofstream *)operator_new(0x200);
  local_180._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_180);
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_90[0]);
  plVar19 = plVar14 + 2;
  if ((__node_base *)*plVar14 == (__node_base *)plVar19) {
    local_120._M_before_begin._M_nxt = (_Hash_node_base *)*plVar19;
    local_120._M_element_count = plVar14[3];
    local_120._M_buckets = &p_Var2->_M_nxt;
  }
  else {
    local_120._M_before_begin._M_nxt = (_Hash_node_base *)*plVar19;
    local_120._M_buckets = (__buckets_ptr)*plVar14;
  }
  local_120._M_bucket_count = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_120);
  plVar19 = plVar14 + 2;
  if ((iterator *)*plVar14 == (iterator *)plVar19) {
    local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar19;
    local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)plVar14[3];
    local_e8._M_impl.super__Deque_impl_data._M_map = &piVar3->_M_cur;
  }
  else {
    local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar19;
    local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)*plVar14;
  }
  local_e8._M_impl.super__Deque_impl_data._M_map_size = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::ofstream::ofstream(poVar13,(string *)&local_e8,_S_out);
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[4] =
       (basic_ostream<char,_std::char_traits<char>_> *)poVar13;
  if ((iterator *)local_e8._M_impl.super__Deque_impl_data._M_map != piVar3) {
    operator_delete(local_e8._M_impl.super__Deque_impl_data._M_map,
                    (ulong)(local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 1));
  }
  if ((__node_base *)local_120._M_buckets != p_Var2) {
    operator_delete(local_120._M_buckets,
                    (ulong)((long)&(local_120._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if ((_Base_ptr *)local_180._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)local_180._M_impl._0_8_,
                    (ulong)((long)&(local_180._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  poVar13 = (ofstream *)operator_new(0x200);
  local_180._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_180);
  plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_90[0]);
  plVar19 = plVar14 + 2;
  if ((__node_base *)*plVar14 == (__node_base *)plVar19) {
    local_120._M_before_begin._M_nxt = (_Hash_node_base *)*plVar19;
    local_120._M_element_count = plVar14[3];
    local_120._M_buckets = &p_Var2->_M_nxt;
  }
  else {
    local_120._M_before_begin._M_nxt = (_Hash_node_base *)*plVar19;
    local_120._M_buckets = (__buckets_ptr)*plVar14;
  }
  local_120._M_bucket_count = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_120);
  plVar19 = plVar14 + 2;
  if ((iterator *)*plVar14 == (iterator *)plVar19) {
    local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar19;
    local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)plVar14[3];
    local_e8._M_impl.super__Deque_impl_data._M_map = &piVar3->_M_cur;
  }
  else {
    local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar19;
    local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)*plVar14;
  }
  local_e8._M_impl.super__Deque_impl_data._M_map_size = plVar14[1];
  *plVar14 = (long)plVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  std::ofstream::ofstream(poVar13,(string *)&local_e8,_S_out);
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[5] =
       (basic_ostream<char,_std::char_traits<char>_> *)poVar13;
  if ((iterator *)local_e8._M_impl.super__Deque_impl_data._M_map != piVar3) {
    operator_delete(local_e8._M_impl.super__Deque_impl_data._M_map,
                    (ulong)(local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 1));
  }
  if ((__node_base *)local_120._M_buckets != p_Var2) {
    operator_delete(local_120._M_buckets,
                    (ulong)((long)&(local_120._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  ppbVar9 = local_148.
            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppbVar21 = local_148.
             super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if ((_Base_ptr *)local_180._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)local_180._M_impl._0_8_,
                    (ulong)((long)&(local_180._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
    ppbVar9 = local_148.
              super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppbVar21 = local_148.
               super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; ppbVar10 = local_148.
                    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
      ppbVar9 !=
      local_148.
      super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppbVar9 = ppbVar9 + 1) {
    poVar15 = (ostream *)*ppbVar9;
    local_148.
    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppbVar21;
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"MEM(KB)",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,(this->super_Abstract<4U>).name._M_dataplus._M_p,
                         (this->super_Abstract<4U>).name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
    cVar8 = (char)*ppbVar9;
    std::ios::widen((char)*(undefined8 *)(*(long *)*ppbVar9 + -0x18) + cVar8);
    std::ostream::put(cVar8);
    std::ostream::flush();
    ppbVar21 = local_148.
               super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_148.
    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppbVar10;
  }
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_148.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppbVar21;
  std::_Deque_base<bool,_std::allocator<bool>_>::_M_initialize_map(&local_e8,0);
  local_150 = (int *)operator_new(4);
  local_120._M_buckets = &local_120._M_single_bucket;
  local_120._M_bucket_count = 1;
  local_120._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_120._M_element_count = 0;
  *local_150 = 0;
  local_120._M_rehash_policy._M_max_load_factor = 1.0;
  local_120._M_rehash_policy._M_next_resize = 0;
  local_120._M_single_bucket = (__node_base_ptr)0x0;
  local_180._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_180._M_impl.super__Rb_tree_header._M_header;
  local_180._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_180._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_180._M_impl.super__Rb_tree_header._M_node_count = 0;
  pDVar12 = local_58;
  local_180._M_impl.super__Rb_tree_header._M_header._M_right =
       local_180._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < local_184) {
    local_5c = (int)(local_68 * 0.005);
    local_50 = (double)local_5c;
    local_40 = local_50 * 0.732;
    local_48 = local_50 * 0.768;
    local_38 = (long)local_5c;
    uVar20 = 0;
    do {
      __k = pDVar12 + uVar20;
      puVar16 = (uint *)std::__detail::
                        _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&local_120,__k);
      local_128.first = *puVar16;
      local_128.second.str = *&__k->str;
      iVar17 = std::
               _Rb_tree<std::pair<unsigned_int,_Data<4U>_>,_std::pair<unsigned_int,_Data<4U>_>,_std::_Identity<std::pair<unsigned_int,_Data<4U>_>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
               ::find(&local_180,&local_128);
      if ((_Rb_tree_header *)iVar17._M_node != &local_180._M_impl.super__Rb_tree_header) {
        pVar27 = std::
                 _Rb_tree<std::pair<unsigned_int,_Data<4U>_>,_std::pair<unsigned_int,_Data<4U>_>,_std::_Identity<std::pair<unsigned_int,_Data<4U>_>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
                 ::equal_range(&local_180,&local_128);
        std::
        _Rb_tree<std::pair<unsigned_int,_Data<4U>_>,_std::pair<unsigned_int,_Data<4U>_>,_std::_Identity<std::pair<unsigned_int,_Data<4U>_>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
        ::_M_erase_aux(&local_180,(_Base_ptr)pVar27.first._M_node,(_Base_ptr)pVar27.second._M_node);
      }
      pmVar18 = std::__detail::
                _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&local_120,__k);
      *pmVar18 = *pmVar18 + 1;
      puVar16 = (uint *)std::__detail::
                        _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&local_120,__k);
      local_128.first = *puVar16;
      local_128.second.str = *&__k->str;
      pVar28 = std::
               _Rb_tree<std::pair<unsigned_int,_Data<4U>_>,_std::pair<unsigned_int,_Data<4U>_>,_std::_Identity<std::pair<unsigned_int,_Data<4U>_>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
               ::_M_get_insert_equal_pos(&local_180,&local_128);
      local_70._M_t = &local_180;
      std::
      _Rb_tree<std::pair<unsigned_int,Data<4u>>,std::pair<unsigned_int,Data<4u>>,std::_Identity<std::pair<unsigned_int,Data<4u>>>,std::less<std::pair<unsigned_int,Data<4u>>>,std::allocator<std::pair<unsigned_int,Data<4u>>>>
      ::
      _M_insert_<std::pair<unsigned_int,Data<4u>>const&,std::_Rb_tree<std::pair<unsigned_int,Data<4u>>,std::pair<unsigned_int,Data<4u>>,std::_Identity<std::pair<unsigned_int,Data<4u>>>,std::less<std::pair<unsigned_int,Data<4u>>>,std::allocator<std::pair<unsigned_int,Data<4u>>>>::_Alloc_node>
                ((_Rb_tree<std::pair<unsigned_int,Data<4u>>,std::pair<unsigned_int,Data<4u>>,std::_Identity<std::pair<unsigned_int,Data<4u>>>,std::less<std::pair<unsigned_int,Data<4u>>>,std::allocator<std::pair<unsigned_int,Data<4u>>>>
                  *)&local_180,pVar28.first,pVar28.second,&local_128,&local_70);
      if (1000 < local_180._M_impl.super__Rb_tree_header._M_node_count) {
        std::
        _Rb_tree<std::pair<unsigned_int,Data<4u>>,std::pair<unsigned_int,Data<4u>>,std::_Identity<std::pair<unsigned_int,Data<4u>>>,std::less<std::pair<unsigned_int,Data<4u>>>,std::allocator<std::pair<unsigned_int,Data<4u>>>>
        ::erase_abi_cxx11_((_Rb_tree<std::pair<unsigned_int,Data<4u>>,std::pair<unsigned_int,Data<4u>>,std::_Identity<std::pair<unsigned_int,Data<4u>>>,std::less<std::pair<unsigned_int,Data<4u>>>,std::allocator<std::pair<unsigned_int,Data<4u>>>>
                            *)&local_180,
                           (const_iterator)local_180._M_impl.super__Rb_tree_header._M_header._M_left
                          );
      }
      iVar11 = (*(this->super_Abstract<4U>)._vptr_Abstract[3])(this,__k);
      local_70._M_t._0_1_ = iVar11 != 0;
      if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<bool,std::allocator<bool>>::_M_push_back_aux<bool_const&>
                  ((deque<bool,std::allocator<bool>> *)&local_e8,(bool *)&local_70);
      }
      else {
        *local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = iVar11 != 0;
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      *local_150 = *local_150 + (uint)(byte)local_70._M_t;
      (**(this->super_Abstract<4U>)._vptr_Abstract)(this,__k);
      if (local_38 <= (long)uVar20) {
        *local_150 = *local_150 - (uint)*local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (local_e8._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_e8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_e8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_e8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_e8._M_impl.super__Deque_impl_data._M_start._M_last =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x200;
          local_e8._M_impl.super__Deque_impl_data._M_start._M_first =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_e8._M_impl.super__Deque_impl_data._M_start._M_node =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_e8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
      }
      if ((uVar20 != 0) &&
         ((int)((long)((ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | uVar20 & 0xffffffff) %
               (long)local_5c) == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"checkpoint= ",0xc)
        ;
        local_68 = (double)(int)uVar20;
        poVar15 = std::ostream::_M_insert<double>((local_68 / (double)local_184) * 100.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," %",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
        ppbVar9 = local_148.
                  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppbVar21 = local_148.
                        super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppbVar21 != ppbVar9;
            ppbVar21 = ppbVar21 + 1) {
          poVar15 = std::ostream::_M_insert<double>(local_68 / (double)local_184);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
        }
        WavingSketch<8U,_1U,_4U>::Check
                  (this,(HashMap<4U> *)&local_120,
                   local_180._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color,&local_148)
        ;
        auVar4._8_8_ = in_XMM2_Qb;
        auVar4._0_8_ = in_XMM2_Qa;
        auVar4 = vcvtusi2sd_avx512f(auVar4,*local_150);
        poVar15 = std::ostream::_M_insert<double>(auVar4._0_8_ / local_50);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
        auVar23._0_8_ = log2((double)((this->BUCKET_NUM * 0x42) / 1000));
        auVar23._8_56_ = extraout_var;
        auVar4 = vroundsd_avx(auVar23._0_16_,auVar23._0_16_,9);
        dVar22 = exp2(auVar4._0_8_);
        poVar15 = std::ostream::_M_insert<double>(dVar22 * 1000.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,",",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hit Rate: ",10);
        auVar5._8_8_ = in_XMM2_Qb;
        auVar5._0_8_ = in_XMM2_Qa;
        auVar4 = vcvtusi2sd_avx512f(auVar5,*local_150);
        poVar15 = std::ostream::_M_insert<double>(auVar4._0_8_ / local_50);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," Mem: ",6);
        auVar24._0_8_ = log2((double)((this->BUCKET_NUM * 0x42) / 1000));
        auVar24._8_56_ = extraout_var_00;
        auVar4 = vroundsd_avx(auVar24._0_16_,auVar24._0_16_,9);
        dVar22 = exp2(auVar4._0_8_);
        poVar15 = std::ostream::_M_insert<double>(dVar22);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," KB",3);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
        if ((this->BUCKET_NUM * 0x42 < 0x108000) &&
           (auVar6._8_8_ = in_XMM2_Qb, auVar6._0_8_ = in_XMM2_Qa,
           auVar4 = vcvtusi2sd_avx512f(auVar6,*local_150), auVar4._0_8_ < local_40)) {
          WavingSketch<8U,_1U,_4U>::expand(this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ID=",3);
          poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15," expand to ",0xb);
          auVar25._0_8_ = log2((double)((this->BUCKET_NUM * 0x42) / 1000));
          auVar25._8_56_ = extraout_var_01;
          auVar4 = vroundsd_avx(auVar25._0_16_,auVar25._0_16_,9);
          dVar22 = exp2(auVar4._0_8_);
          poVar15 = std::ostream::_M_insert<double>(dVar22);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"KB",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
        }
        ppbVar21 = local_148.
                   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppbVar9 = local_148.
                  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((0x8400 < this->BUCKET_NUM * 0x42) &&
           (auVar7._8_8_ = in_XMM2_Qb, auVar7._0_8_ = in_XMM2_Qa,
           auVar4 = vcvtusi2sd_avx512f(auVar7,*local_150), local_48 < auVar4._0_8_)) {
          WavingSketch<8U,_1U,_4U>::shrink(this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ID=",3);
          poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15," shrink to ",0xb);
          auVar26._0_8_ = log2((double)((this->BUCKET_NUM * 0x42) / 1000));
          auVar26._8_56_ = extraout_var_02;
          auVar4 = vroundsd_avx(auVar26._0_16_,auVar26._0_16_,9);
          dVar22 = exp2(auVar4._0_8_);
          poVar15 = std::ostream::_M_insert<double>(dVar22);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"KB",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          ppbVar21 = local_148.
                     super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppbVar9 = local_148.
                    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; ppbVar21 != ppbVar9; ppbVar21 = ppbVar21 + 1) {
          cVar8 = (char)*ppbVar21;
          std::ios::widen((char)*(undefined8 *)(*(long *)*ppbVar21 + -0x18) + cVar8);
          std::ostream::put(cVar8);
          std::ostream::flush();
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
        pDVar12 = local_58;
        std::ostream::put(-0x80);
        std::ostream::flush();
      }
      uVar20 = uVar20 + 1;
    } while ((long)uVar20 < (long)local_184);
  }
  if (pDVar12 != (Data<4U> *)0x0) {
    operator_delete(pDVar12,4);
  }
  std::
  _Rb_tree<std::pair<unsigned_int,_Data<4U>_>,_std::pair<unsigned_int,_Data<4U>_>,_std::_Identity<std::pair<unsigned_int,_Data<4U>_>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
  ::~_Rb_tree(&local_180);
  std::
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_120);
  operator_delete(local_150,4);
  std::_Deque_base<bool,_std::allocator<bool>_>::~_Deque_base(&local_e8);
  if (local_148.
      super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  return;
}

Assistant:

void BenchElastic(std::string PATH) {
	printf("\033[0m\033[1;4;33m# Testing function: BenchElastic\n\033[0m");
	count_type cnt = 0;
	Data<DATA_LEN>* items = NULL;
	std::string file = "caida";

	items = read_standard_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);

	constexpr int32_t memory_upper_bound = 1081344;
	constexpr int32_t memory_lower_bound = 16896 * 2;
	constexpr double hit_upper_bound = 0.768;
	constexpr double hit_lower_bound = 0.732;
	int32_t checkpoint = 0.005 * cnt;
	constexpr int32_t K = 1000;
	int output_pointer = 0;
	// constexpr int32_t num_inc = 10;
	int nshrink = 5;
	// constexpr int32_t mem_var = 6;
	constexpr int32_t cmp_num = 1;

	WavingSketch<8, 1, DATA_LEN>* sketches[cmp_num];

	sketches[0] = new WavingSketch<8, 1, DATA_LEN>(memory_upper_bound / (8 * 8 + 1 * 2));

	std::vector<std::ostream*> outs(6);
	outs[0] = new std::ofstream(RESULT_FOLDER + "elasticExpand_" + file + "_ARE.csv");
	outs[1] = new std::ofstream(RESULT_FOLDER + "elasticExpand_" + file + "_CR.csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "elasticExpand_" + file + "_PR.csv");
	outs[3] = new std::ofstream(RESULT_FOLDER + "elasticExpand_" + file + "_F1.csv");
	outs[4] = new std::ofstream(RESULT_FOLDER + "elasticExpand_" + file + "_HR.csv");
	outs[5] = new std::ofstream(RESULT_FOLDER + "elasticExpand_" + file + "_MEM.csv");
	for (auto& out : outs)
	{
		*out << "MEM(KB)" << "," << sketches[0]->name << ",";
		*out << std::endl;
	}
	std::queue<bool> hits[cmp_num];
	std::vector<uint32_t> total(cmp_num, 0);
	HashMap<DATA_LEN> mp;
	std::multiset<std::pair<uint32_t, Data<DATA_LEN>>> topk_items;
	for (int l = 0; l < cnt; ++l) {
		std::pair<uint32_t, Data<DATA_LEN>> p = std::make_pair(mp[items[l]], items[l]);
		if (topk_items.find(p) != topk_items.end())
		{
			topk_items.erase(p);
		}
		mp[items[l]] += 1;
		p = std::make_pair(mp[items[l]], items[l]);
		topk_items.insert(p);
		if (topk_items.size() > K)
		{
			topk_items.erase(topk_items.begin());
		}
		for (int j = 0; j < cmp_num; ++j) {
			bool is_hit = sketches[j]->QueryTopK(items[l]) != 0;
			hits[j].push(is_hit);
			total[j] += is_hit;
			sketches[j]->Init(items[l]);
			if (l >= checkpoint)
			{
				total[j] -= hits[j].front();
				hits[j].pop();
			}
		}
		if (l % checkpoint == 0 && l)// checkpoint=1 when slide window
		{
			std::cout << "checkpoint= " << l * 1.0 / cnt * 100 << " %" << std::endl;
			for (auto& out : outs)
			{
				*out << l * 1.0 / cnt << ",";
			}
			for (int j = 0; j < cmp_num; j++)
			{
				uint32_t topK = topk_items.begin()->first;
				sketches[j]->Check(mp, topK, outs);
				*outs[4] << total[j] * 1.0 / checkpoint << ",";
				*outs[5] << pow(2, floor(log2(sketches[j]->getMemSize() / 1000))) * 1000 << ",";
				std::cout << "Hit Rate: " << total[j] * 1.0 / checkpoint
					<< " Mem: " << pow(2, floor(log2(sketches[j]->getMemSize() / 1000))) << " KB" << std::endl;

				if (sketches[j]->getMemSize() < memory_upper_bound
					&& total[j] < hit_lower_bound * checkpoint)
				{
					sketches[j]->expand();
					std::cout << "ID=" << j << " expand to " << pow(2, floor(log2(sketches[j]->getMemSize() / 1000))) << "KB" << std::endl;
				}
				if (sketches[j]->getMemSize() > memory_lower_bound
					&& total[j] > hit_upper_bound * checkpoint)
				{
					sketches[j]->shrink();
					std::cout << "ID=" << j << " shrink to " << pow(2, floor(log2(sketches[j]->getMemSize() / 1000))) << "KB" << std::endl;
				}
			}
			for (auto& out : outs)
			{
				*out << std::endl;
			}
			std::cout << std::endl;
		}
	}
	delete items;
}